

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseKernel.hh
# Opt level: O2

void __thiscall
OpenMesh::BaseKernel::copy_all_properties
          (BaseKernel *this,FaceHandle _fh_from,FaceHandle _fh_to,bool _copyBuildIn)

{
  bool bVar1;
  BaseProperty *pBVar2;
  pointer ppBVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  long local_40;
  long local_38;
  
  ppBVar3 = (this->fprops_).properties_.
            super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_40 = (long)(int)_fh_from.super_BaseHandle.idx_;
  local_38 = (long)(int)_fh_to.super_BaseHandle.idx_;
  do {
    if (ppBVar3 ==
        (this->fprops_).properties_.
        super__Vector_base<OpenMesh::BaseProperty_*,_std::allocator<OpenMesh::BaseProperty_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      return;
    }
    pBVar2 = *ppBVar3;
    if (pBVar2 == (BaseProperty *)0x0 || _copyBuildIn) {
      if (pBVar2 != (BaseProperty *)0x0) {
LAB_001ae685:
        (*pBVar2->_vptr_BaseProperty[7])(pBVar2,local_40,local_38);
      }
    }
    else {
      std::__cxx11::string::substr((ulong)&local_60,(ulong)&pBVar2->name_);
      bVar1 = std::operator!=(&local_60,"f:");
      std::__cxx11::string::~string((string *)&local_60);
      if (bVar1) {
        pBVar2 = *ppBVar3;
        goto LAB_001ae685;
      }
    }
    ppBVar3 = ppBVar3 + 1;
  } while( true );
}

Assistant:

void copy_all_properties(FaceHandle _fh_from, FaceHandle _fh_to, bool _copyBuildIn = false) {

    for( PropertyContainer::iterator p_it = fprops_.begin();
        p_it != fprops_.end(); ++p_it) {

      // Copy all properties, if build in is true
      // Otherwise, copy only properties without build in specifier
      if ( *p_it && ( _copyBuildIn || (*p_it)->name().substr(0,2) != "f:") )
        (*p_it)->copy(_fh_from.idx(), _fh_to.idx());
    }

  }